

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::AddImportError
          (DescriptorBuilder *this,FileDescriptorProto *proto,int index)

{
  string *psVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string message;
  int index_local;
  FileDescriptorProto *proto_local;
  DescriptorBuilder *this_local;
  
  message.field_2._12_4_ = index;
  std::__cxx11::string::string((string *)local_40);
  if (this->pool_->fallback_database_ == (DescriptorDatabase *)0x0) {
    psVar1 = FileDescriptorProto::dependency_abi_cxx11_(proto,message.field_2._12_4_);
    std::operator+(&local_80,"Import \"",psVar1);
    std::operator+(&local_60,&local_80,"\" has not been loaded.");
    std::__cxx11::string::operator=((string *)local_40,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  else {
    psVar1 = FileDescriptorProto::dependency_abi_cxx11_(proto,message.field_2._12_4_);
    std::operator+(&local_d0,"Import \"",psVar1);
    std::operator+(&local_b0,&local_d0,"\" was not found or had errors.");
    std::__cxx11::string::operator=((string *)local_40,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  psVar1 = FileDescriptorProto::name_abi_cxx11_(proto);
  AddError(this,psVar1,&proto->super_Message,OTHER,(string *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void DescriptorBuilder::AddImportError(const FileDescriptorProto& proto,
                                       int index) {
  string message;
  if (pool_->fallback_database_ == NULL) {
    message = "Import \"" + proto.dependency(index) +
              "\" has not been loaded.";
  } else {
    message = "Import \"" + proto.dependency(index) +
              "\" was not found or had errors.";
  }
  AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER, message);
}